

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueConverter.cpp
# Opt level: O2

void helics::detail::convertFromBinary(byte *data,NamedPoint *val)

{
  size_t sVar1;
  
  val->value = *(double *)(data + 8);
  sVar1 = getDataSize(data);
  std::__cxx11::string::assign<char_const*,void>
            ((string *)val,(char *)(data + 0x10),(char *)(data + sVar1 + 0x10));
  if ((*data & 1) == 0) {
    return;
  }
  checks::swapBytes<8ul>((byte *)&val->value);
  return;
}

Assistant:

void convertFromBinary(const std::byte* data, NamedPoint& val)
{
    std::memcpy(&val.value, data + 8, 8);
    const std::size_t size = getDataSize(data);
    val.name.assign(reinterpret_cast<const char*>(data) + 16U,
                    reinterpret_cast<const char*>(data) + 16U + size);
    if ((data[0] & endianMask) != littleEndianCode) {
        checks::swapBytes<8>(reinterpret_cast<std::byte*>(&val.value));
    }
}